

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

Real M_GetEl(Matrix *M,size_t Row,size_t Clm)

{
  LASErrIdType LVar1;
  size_t sVar2;
  Real *pRVar3;
  Real RVar4;
  
  LVar1 = LASResult();
  RVar4 = 0.0;
  if (LVar1 == LASOK) {
    if ((((Row == 0) || (Clm == 0)) || (M->RowDim < Row)) || (M->ClmDim < Clm)) {
      LASError(LASRangeErr,"M_GetEl",M->Name,(char *)0x0,(char *)0x0);
      RVar4 = 0.0;
    }
    else if (M->ElOrder == Clmws) {
      sVar2 = M->Len[Clm];
      if (sVar2 != 0) {
        pRVar3 = &M->El[Clm]->Val;
        do {
          if (((ElType *)(pRVar3 + -1))->Pos == Row) {
            RVar4 = *pRVar3;
          }
          pRVar3 = pRVar3 + 2;
          sVar2 = sVar2 - 1;
        } while (sVar2 != 0);
      }
    }
    else if ((M->ElOrder == Rowws) && (sVar2 = M->Len[Row], sVar2 != 0)) {
      pRVar3 = &M->El[Row]->Val;
      do {
        if (((ElType *)(pRVar3 + -1))->Pos == Clm) {
          RVar4 = *pRVar3;
        }
        pRVar3 = pRVar3 + 2;
        sVar2 = sVar2 - 1;
      } while (sVar2 != 0);
    }
  }
  return RVar4;
}

Assistant:

Real M_GetEl(Matrix *M, size_t Row, size_t Clm)
/* returns the value of a matrix element (all matrix elements are considered) */
{
    Real Val;
    
    size_t Len, ElCount;
    ElType *PtrEl;

    if (LASResult() == LASOK) {
        if (Row > 0 && Row <= M->RowDim && Clm > 0 && Clm <= M->ClmDim) {
            Val = 0.0;
            if (M->ElOrder == Rowws) {
                Len = M->Len[Row];
                PtrEl = M->El[Row];
                for (ElCount = Len; ElCount > 0; ElCount--) {
                    if ((*PtrEl).Pos == Clm)
                        Val = (*PtrEl).Val;
                    PtrEl++;
                }
            } else if (M->ElOrder == Clmws) {
                Len = M->Len[Clm];
                PtrEl = M->El[Clm];
                for (ElCount = Len; ElCount > 0; ElCount--) {
                    if ((*PtrEl).Pos == Row)
                        Val = (*PtrEl).Val;
                    PtrEl++;
                }
            }
        } else {
            LASError(LASRangeErr, "M_GetEl", M->Name, NULL, NULL);
            Val = 0.0;
        }
    } else {
        Val = 0.0;
    }
    return(Val);
}